

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::TestSpecParser::addTagPattern(TestSpecParser *this)

{
  string token;
  unique_ptr<Catch::TestSpec::TagPattern> local_38;
  string local_30;
  
  preprocessPattern_abi_cxx11_(&local_30,this);
  if (local_30._M_string_length != 0) {
    if ((local_30._M_string_length != 1) && (*local_30._M_dataplus._M_p == '.')) {
      std::__cxx11::string::_M_erase((ulong)&local_30,0);
      if (this->m_exclusion == true) {
        Detail::make_unique<Catch::TestSpec::TagPattern,char_const(&)[2],std::__cxx11::string&>
                  ((Detail *)&local_38,(char (*) [2])0x2b8af4,&this->m_substring);
        std::
        vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>>>
        ::emplace_back<Catch::Detail::unique_ptr<Catch::TestSpec::TagPattern>>
                  ((vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>>>
                    *)&(this->m_currentFilter).m_forbidden,&local_38);
      }
      else {
        Detail::make_unique<Catch::TestSpec::TagPattern,char_const(&)[2],std::__cxx11::string&>
                  ((Detail *)&local_38,(char (*) [2])0x2b8af4,&this->m_substring);
        std::
        vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>>>
        ::emplace_back<Catch::Detail::unique_ptr<Catch::TestSpec::TagPattern>>
                  ((vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>>>
                    *)&this->m_currentFilter,&local_38);
      }
      if (local_38.m_ptr != (TagPattern *)0x0) {
        (*((local_38.m_ptr)->super_Pattern)._vptr_Pattern[1])();
      }
    }
    if (this->m_exclusion == true) {
      Detail::make_unique<Catch::TestSpec::TagPattern,std::__cxx11::string&,std::__cxx11::string&>
                ((Detail *)&local_38,&local_30,&this->m_substring);
      std::
      vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>>>
      ::emplace_back<Catch::Detail::unique_ptr<Catch::TestSpec::TagPattern>>
                ((vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>>>
                  *)&(this->m_currentFilter).m_forbidden,&local_38);
    }
    else {
      Detail::make_unique<Catch::TestSpec::TagPattern,std::__cxx11::string&,std::__cxx11::string&>
                ((Detail *)&local_38,&local_30,&this->m_substring);
      std::
      vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>>>
      ::emplace_back<Catch::Detail::unique_ptr<Catch::TestSpec::TagPattern>>
                ((vector<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>,std::allocator<Catch::Detail::unique_ptr<Catch::TestSpec::Pattern>>>
                  *)&this->m_currentFilter,&local_38);
    }
    if (local_38.m_ptr != (TagPattern *)0x0) {
      (*((local_38.m_ptr)->super_Pattern)._vptr_Pattern[1])();
    }
  }
  (this->m_substring)._M_string_length = 0;
  *(this->m_substring)._M_dataplus._M_p = '\0';
  this->m_exclusion = false;
  this->m_mode = None;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TestSpecParser::addTagPattern() {
        auto token = preprocessPattern();

        if (!token.empty()) {
            // If the tag pattern is the "hide and tag" shorthand (e.g. [.foo])
            // we have to create a separate hide tag and shorten the real one
            if (token.size() > 1 && token[0] == '.') {
                token.erase(token.begin());
                if (m_exclusion) {
                    m_currentFilter.m_forbidden.emplace_back(Detail::make_unique<TestSpec::TagPattern>(".", m_substring));
                } else {
                    m_currentFilter.m_required.emplace_back(Detail::make_unique<TestSpec::TagPattern>(".", m_substring));
                }
            }
            if (m_exclusion) {
                m_currentFilter.m_forbidden.emplace_back(Detail::make_unique<TestSpec::TagPattern>(token, m_substring));
            } else {
                m_currentFilter.m_required.emplace_back(Detail::make_unique<TestSpec::TagPattern>(token, m_substring));
            }
        }
        m_substring.clear();
        m_exclusion = false;
        m_mode = None;
    }